

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::LargeHeapBlock::IsPageDirty
          (LargeHeapBlock *this,char *page,RescanFlags flags,bool isWriteBarrier)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  
  if (DAT_015d641d == '\x01' && !isWriteBarrier) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x4ab,"(isWriteBarrier)","isWriteBarrier");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (isWriteBarrier) {
    bVar3 = RecyclerWriteBarrierManager::GetWriteBarrier(page);
    return (bool)(bVar3 & 1);
  }
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

bool LargeHeapBlock::IsPageDirty(char* page, RescanFlags flags, bool isWriteBarrier)
{
#ifdef RECYCLER_WRITE_BARRIER
    // TODO: SWB, use special page allocator for large block with write barrier?
    if (CONFIG_FLAG(WriteBarrierTest))
    {
        Assert(isWriteBarrier);
    }
    if (isWriteBarrier)
    {
        return (RecyclerWriteBarrierManager::GetWriteBarrier(page) & DIRTYBIT) == DIRTYBIT;
    }
#endif

#ifdef RECYCLER_WRITE_WATCH
    if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
    {
        ULONG_PTR count = 1;
        DWORD pageSize = AutoSystemInfo::PageSize;
        DWORD const writeWatchFlags = (flags & RescanFlags_ResetWriteWatch ? WRITE_WATCH_FLAG_RESET : 0);
        void * written = nullptr;
        UINT ret = GetWriteWatch(writeWatchFlags, page, AutoSystemInfo::PageSize, &written, &count, &pageSize);
        bool isDirty = (ret != 0) || (count == 1);
        return isDirty;
    }
    else
    {
        Js::Throw::FatalInternalError();
    }
#else
    Js::Throw::FatalInternalError();
#endif
}